

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fct_ts__add_test(fct_ts_t *ts,fct_test_t *test)

{
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0) && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                  ,0x4a4,"void fct_ts__add_test(fct_ts_t *, fct_test_t *)");
  }
  if (test != (fct_test_t *)0x0) {
    if (ts->mode != ts_mode_end) {
      fct_nlist__append(&ts->test_list,test);
      return;
    }
    __assert_fail("!((ts)->mode == ts_mode_end)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                  ,0x4a6,"void fct_ts__add_test(fct_ts_t *, fct_test_t *)");
  }
  __assert_fail("test != ((void*)0) && \"invalid arg\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                ,0x4a5,"void fct_ts__add_test(fct_ts_t *, fct_test_t *)");
}

Assistant:

static void
fct_ts__add_test(fct_ts_t *ts, fct_test_t *test)
{
    FCT_ASSERT( ts != NULL && "invalid arg");
    FCT_ASSERT( test != NULL && "invalid arg");
    FCT_ASSERT( !fct_ts__is_end(ts) );
    fct_nlist__append(&(ts->test_list), test);
}